

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O3

void Dch_ObjAddToFrontier(Dch_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  
  if (((ulong)pObj & 1) == 0) {
    if ((p->pSatVars[pObj->Id] == 0) && ((*(uint *)&pObj->field_0x18 & 7) != 1)) {
      pVVar3 = p->vUsedNodes;
      uVar1 = pVVar3->nSize;
      if (uVar1 == pVVar3->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      iVar2 = pVVar3->nSize;
      pVVar3->nSize = iVar2 + 1;
      ppvVar4[iVar2] = pObj;
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      p->pSatVars[pObj->Id] = iVar2;
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        uVar1 = vFrontier->nSize;
        if (uVar1 == vFrontier->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vFrontier->pArray,0x80);
            }
            vFrontier->pArray = ppvVar4;
            vFrontier->nCap = 0x10;
          }
          else {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vFrontier->pArray,(ulong)uVar1 << 4);
            }
            vFrontier->pArray = ppvVar4;
            vFrontier->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar4 = vFrontier->pArray;
        }
        iVar2 = vFrontier->nSize;
        vFrontier->nSize = iVar2 + 1;
        ppvVar4[iVar2] = pObj;
      }
    }
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchCnf.c"
                ,0x108,"void Dch_ObjAddToFrontier(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dch_ObjAddToFrontier( Dch_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    assert( Dch_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Dch_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}